

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::TENSOR_INITIALIZING_1_Test::TestBody(TENSOR_INITIALIZING_1_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  initializer_list<int> __l;
  AssertionResult gtest_ar;
  tensor<int,_1U> ts;
  Message local_78;
  AssertHelper local_70;
  undefined1 *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_60;
  undefined4 local_58;
  vector<int,_std::allocator<int>_> local_48;
  tensor<int,_1U> local_30;
  
  local_68 = &DAT_200000001;
  sStack_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  local_58 = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,(allocator_type *)&local_78);
  dnet::data_types::tensor<int,_1U>::tensor(&local_30,&local_48,(array<unsigned_int,_1UL>)0x5);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_78.ss_.ptr_._0_4_ = 0;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]
                     (&local_30,(array<unsigned_int,_1UL> *)&local_78);
  local_70.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"(ts[{0}])","1",piVar2,(int *)&local_70);
  if (local_68._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (sStack_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x53,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_4_ = 1;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]
                     (&local_30,(array<unsigned_int,_1UL> *)&local_78);
  local_70.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"(ts[{1}])","2",piVar2,(int *)&local_70);
  if (local_68._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (sStack_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ss_.ptr_._0_4_ = 3;
  piVar2 = dnet::data_types::tensor<int,_1U>::operator[]
                     (&local_30,(array<unsigned_int,_1UL> *)&local_78);
  local_70.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_68,"(ts[{3}])","4",piVar2,(int *)&local_70);
  if (local_68._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (sStack_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_1) {
        tensor<int, 1> ts({1,2,3,4,5}, {5});
        EXPECT_EQ((ts[{0}]), 1);
        EXPECT_EQ((ts[{1}]), 2);
        EXPECT_EQ((ts[{3}]), 4);
    }